

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall
mario::TimerQueue::reset
          (TimerQueue *this,
          vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          *expired,Timestamp now)

{
  iterator iVar1;
  _Any_data *this_00;
  pointer ppVar2;
  Timestamp nextExpire;
  ActiveTimer timer;
  Timestamp local_50;
  Timestamp local_48;
  key_type local_40;
  
  local_48._microSecondsSinceEpoch = now._microSecondsSinceEpoch;
  Timestamp::Timestamp(&local_50);
  ppVar2 = (expired->
           super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (expired->
                super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = (_Any_data *)ppVar2->second;
      local_40.second = *(long *)(this_00->_M_pod_data + 0x38);
      local_40.first = (Timer *)this_00;
      if (this_00->_M_pod_data[0x30] == '\x01') {
        iVar1 = std::
                _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
                ::find(&(this->_cancelingTimers)._M_t,&local_40);
        this_00 = (_Any_data *)ppVar2->second;
        if ((_Rb_tree_header *)iVar1._M_node !=
            &(this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header) {
          if (this_00 != (_Any_data *)0x0) goto LAB_00109317;
          this_00 = (_Any_data *)0x0;
          goto LAB_0010934c;
        }
        Timer::restart((Timer *)this_00,local_48);
        insert(this,ppVar2->second);
      }
      else {
LAB_00109317:
        if (*(code **)(this_00 + 1) != (code *)0x0) {
          (**(code **)(this_00 + 1))(this_00,this_00,__destroy_functor);
        }
LAB_0010934c:
        operator_delete(this_00);
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != (expired->
                       super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_50._microSecondsSinceEpoch =
         *(int64_t *)
          ((this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent + 1);
  }
  if (0 < local_50._microSecondsSinceEpoch) {
    detail::resetTimerfd(this->_timerfd,local_50);
  }
  return;
}

Assistant:

void TimerQueue::reset(const std::vector<Entry>& expired, Timestamp now) {
    Timestamp nextExpire;

    for (auto it = expired.cbegin(); it != expired.cend(); ++it) {
        ActiveTimer timer(it->second, it->second->sequence());
        if (it->second->repeat() && _cancelingTimers.find(timer) == _cancelingTimers.end()) {
            it->second->restart(now);
            insert(it->second);
        } else {
            delete it->second;
        }
    }

    if (!_timers.empty()) {
        nextExpire = _timers.begin()->second->expiration();
    }
    if (nextExpire.valid()) {
        resetTimerfd(_timerfd, nextExpire);
    }
}